

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMoveUspAn<(moira::Instr)76,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  if ((this->reg).sr.s != false) {
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38) =
         *(undefined4 *)((long)this->exec + (ulong)(this->reg).sr.s * 4 + -0x1c);
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execMoveUspAn(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int an = _____________xxx(opcode);
    prefetch<POLLIPL>();
    writeA(an, getUSP());
}